

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O2

bool leveldb::GetLevel(Slice *input,int *level)

{
  bool bVar1;
  long in_FS_OFFSET;
  uint32_t v;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = GetVarint32(input,&local_1c);
  if (local_1c < 7 && bVar1) {
    *level = local_1c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_1c < 7 && bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool GetLevel(Slice* input, int* level) {
  uint32_t v;
  if (GetVarint32(input, &v) && v < config::kNumLevels) {
    *level = v;
    return true;
  } else {
    return false;
  }
}